

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.cc
# Opt level: O2

void __thiscall
gmath::OrthoCamera::reconstructRay(OrthoCamera *this,Vector3d *V,Vector3d *C,Vector2d *p)

{
  SVector<double,_3> local_58;
  SVector<double,_3> local_40;
  
  local_58.v[0] = 0.0;
  local_58.v[1] = 0.0;
  local_58.v[2] = -1.0;
  SMatrix<double,_3,_3>::operator*(&local_40,&(this->super_Camera).R,&local_58);
  SVector<double,_3>::operator=(V,&local_40);
  C->v[0] = p->v[0] * this->res;
  C->v[1] = -p->v[1] * this->res;
  C->v[2] = 0.0;
  SVector<double,_3>::operator+=(C,&(this->super_Camera).T);
  return;
}

Assistant:

void OrthoCamera::reconstructRay(Vector3d &V, Vector3d &C, const Vector2d &p)
const
{
  V=getR()*Vector3d(0, 0, -1);

  C[0]=p[0]*res;
  C[1]=-p[1]*res;
  C[2]=0;

  C+=getT();
}